

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_get_key_exchange_md_ssl_tls
              (mbedtls_ssl_context *ssl,uchar *output,uchar *data,size_t data_len)

{
  int iVar1;
  mbedtls_sha1_context mbedtls_sha1;
  mbedtls_md5_context mbedtls_md5;
  mbedtls_sha1_context local_e4;
  mbedtls_md5_context local_88;
  
  mbedtls_md5_init(&local_88);
  mbedtls_sha1_init(&local_e4);
  iVar1 = mbedtls_md5_starts_ret(&local_88);
  if (iVar1 == 0) {
    iVar1 = mbedtls_md5_update_ret(&local_88,ssl->handshake->randbytes,0x40);
    if (iVar1 == 0) {
      iVar1 = mbedtls_md5_update_ret(&local_88,data,data_len);
      if (iVar1 == 0) {
        iVar1 = mbedtls_md5_finish_ret(&local_88,output);
        if (iVar1 == 0) {
          iVar1 = mbedtls_sha1_starts_ret(&local_e4);
          if (iVar1 == 0) {
            iVar1 = mbedtls_sha1_update_ret(&local_e4,ssl->handshake->randbytes,0x40);
            if (iVar1 == 0) {
              iVar1 = mbedtls_sha1_update_ret(&local_e4,data,data_len);
              if (iVar1 == 0) {
                iVar1 = mbedtls_sha1_finish_ret(&local_e4,output + 0x10);
              }
            }
          }
        }
      }
    }
  }
  mbedtls_md5_free(&local_88);
  mbedtls_sha1_free(&local_e4);
  if (((ssl != (mbedtls_ssl_context *)0x0) && (iVar1 != 0)) &&
     (ssl->conf != (mbedtls_ssl_config *)0x0)) {
    ssl->out_msgtype = 0x15;
    ssl->out_msglen = 2;
    *ssl->out_msg = '\x02';
    ssl->out_msg[1] = 'P';
    mbedtls_ssl_write_record(ssl);
  }
  return iVar1;
}

Assistant:

int mbedtls_ssl_get_key_exchange_md_ssl_tls( mbedtls_ssl_context *ssl,
                                        unsigned char *output,
                                        unsigned char *data, size_t data_len )
{
    int ret = 0;
    mbedtls_md5_context mbedtls_md5;
    mbedtls_sha1_context mbedtls_sha1;

    mbedtls_md5_init( &mbedtls_md5 );
    mbedtls_sha1_init( &mbedtls_sha1 );

    /*
     * digitally-signed struct {
     *     opaque md5_hash[16];
     *     opaque sha_hash[20];
     * };
     *
     * md5_hash
     *     MD5(ClientHello.random + ServerHello.random
     *                            + ServerParams);
     * sha_hash
     *     SHA(ClientHello.random + ServerHello.random
     *                            + ServerParams);
     */
    if( ( ret = mbedtls_md5_starts_ret( &mbedtls_md5 ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_md5_starts_ret", ret );
        goto exit;
    }
    if( ( ret = mbedtls_md5_update_ret( &mbedtls_md5,
                                        ssl->handshake->randbytes, 64 ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_md5_update_ret", ret );
        goto exit;
    }
    if( ( ret = mbedtls_md5_update_ret( &mbedtls_md5, data, data_len ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_md5_update_ret", ret );
        goto exit;
    }
    if( ( ret = mbedtls_md5_finish_ret( &mbedtls_md5, output ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_md5_finish_ret", ret );
        goto exit;
    }

    if( ( ret = mbedtls_sha1_starts_ret( &mbedtls_sha1 ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_sha1_starts_ret", ret );
        goto exit;
    }
    if( ( ret = mbedtls_sha1_update_ret( &mbedtls_sha1,
                                         ssl->handshake->randbytes, 64 ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_sha1_update_ret", ret );
        goto exit;
    }
    if( ( ret = mbedtls_sha1_update_ret( &mbedtls_sha1, data,
                                         data_len ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_sha1_update_ret", ret );
        goto exit;
    }
    if( ( ret = mbedtls_sha1_finish_ret( &mbedtls_sha1,
                                         output + 16 ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_sha1_finish_ret", ret );
        goto exit;
    }

exit:
    mbedtls_md5_free( &mbedtls_md5 );
    mbedtls_sha1_free( &mbedtls_sha1 );

    if( ret != 0 )
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_INTERNAL_ERROR );

    return( ret );

}